

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CNode::SetAddrLocal(CNode *this,CService *addrLocalIn)

{
  uint32_t uVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock32;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->m_addr_local_mutex).super_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  bVar2 = CNetAddr::IsValid(&(this->m_addr_local).super_CNetAddr);
  if (!bVar2) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->m_addr_local,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)addrLocalIn);
    uVar1 = (addrLocalIn->super_CNetAddr).m_scope_id;
    (this->m_addr_local).super_CNetAddr.m_net = (addrLocalIn->super_CNetAddr).m_net;
    (this->m_addr_local).super_CNetAddr.m_scope_id = uVar1;
    (this->m_addr_local).port = addrLocalIn->port;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNode::SetAddrLocal(const CService& addrLocalIn) {
    AssertLockNotHeld(m_addr_local_mutex);
    LOCK(m_addr_local_mutex);
    if (Assume(!m_addr_local.IsValid())) { // Addr local can only be set once during version msg processing
        m_addr_local = addrLocalIn;
    }
}